

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  Location __src;
  Location pCVar1;
  char cVar2;
  int iVar3;
  lconv *plVar4;
  long *plVar5;
  size_t sVar6;
  long *plVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  size_t __n;
  Char buffer [33];
  double value;
  string local_c8;
  double local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Value local_58;
  
  local_a0 = 0.0;
  __src = token->start_;
  pCVar1 = token->end_;
  __n = (long)pCVar1 - (long)__src;
  if ((long)__n < 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Unable to parse token length","");
    addError(this,&local_c8,token,(Location)0x0);
    local_68._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
    _Var9._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return false;
    }
  }
  else {
    if ((long)__n < 0x21) {
      memcpy(&local_c8,__src,__n);
      *(undefined1 *)((long)&local_c8 + __n) = 0;
      plVar4 = localeconv();
      if (plVar4 == (lconv *)0x0) {
        cVar2 = '\0';
      }
      else {
        cVar2 = *plVar4->decimal_point;
      }
      if (((cVar2 != '\0') && (cVar2 != '.')) && (pCVar1 != __src)) {
        sVar6 = 0;
        do {
          if (*(char *)((long)&local_c8._M_dataplus._M_p + sVar6) == '.') {
            *(char *)((long)&local_c8._M_dataplus._M_p + sVar6) = cVar2;
          }
          sVar6 = sVar6 + 1;
        } while (__n != sVar6);
      }
      iVar3 = __isoc99_sscanf(&local_c8,&DAT_005919c1,&local_a0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,__src,pCVar1);
      iVar3 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_005919c1,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar3 == 1) {
      Value::Value(&local_58,local_a0);
      Value::operator=(decoded,&local_58);
      Value::~Value(&local_58);
      return true;
    }
    local_78[0] = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,token->start_,token->end_);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x55c326);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_88 = *plVar7;
      lStack_80 = plVar5[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar7;
      local_98 = (long *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar5[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    addError(this,&local_c8,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    _Var9._M_p = (pointer)local_78[0];
    if (local_78[0] == &local_68) {
      return false;
    }
  }
  operator_delete(_Var9._M_p,local_68._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  size_t const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    JSONCPP_STRING buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}